

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O1

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg
          (nordic_itch_handler *this,itch_order_executed_with_price *m)

{
  ulong uVar1;
  order_book *this_00;
  _Hash_node_base *p_Var2;
  undefined8 uVar3;
  _Hash_node_base *order_id;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  uint64_t uVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  uint64_t uVar10;
  uint64_t quantity;
  execution result;
  trade t;
  event eStack_a8;
  execution local_68;
  trade local_50;
  
  lVar4 = 1;
  do {
    if (m->OrderReferenceNumber[lVar4 + -1] != ' ') {
      pcVar5 = m->OrderReferenceNumber + lVar4 + -1;
      break;
    }
    lVar4 = lVar4 + 1;
    pcVar5 = m->ExecutedQuantity;
  } while (lVar4 != 10);
  order_id = (_Hash_node_base *)0x0;
  for (; pcVar5 != m->ExecutedQuantity; pcVar5 = pcVar5 + 1) {
    order_id = (_Hash_node_base *)(((long)*pcVar5 + (long)order_id * 10) - 0x30);
  }
  uVar1 = (this->order_id_map)._M_h._M_bucket_count;
  uVar6 = (ulong)order_id % uVar1;
  p_Var8 = (this->order_id_map)._M_h._M_buckets[uVar6];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var8->_M_nxt, p_Var9 = p_Var8, order_id != p_Var8->_M_nxt[1]._M_nxt)) {
    while (p_Var8 = p_Var2, p_Var2 = p_Var8->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var9 = p_Var8, order_id == p_Var2[1]._M_nxt)) goto LAB_00117e3d;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_00117e3d:
  if (p_Var9 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var9->_M_nxt;
  }
  if (p_Var2 != (_Hash_node_base *)0x0) {
    lVar4 = 0;
    do {
      if (m->ExecutedQuantity[lVar4] != ' ') {
        pcVar5 = m->ExecutedQuantity + lVar4;
        break;
      }
      lVar4 = lVar4 + 1;
      pcVar5 = m->MatchNumber;
    } while (lVar4 != 9);
    quantity = 0;
    for (; pcVar5 != m->MatchNumber; pcVar5 = pcVar5 + 1) {
      quantity = ((long)*pcVar5 + quantity * 10) - 0x30;
    }
    lVar4 = 0;
    do {
      if (m->TradePrice[lVar4] != ' ') {
        pcVar5 = m->TradePrice + lVar4;
        break;
      }
      lVar4 = lVar4 + 1;
      pcVar5 = m->OwnerParticipantID;
    } while (lVar4 != 10);
    uVar10 = 0;
    for (; pcVar5 != m->OwnerParticipantID; pcVar5 = pcVar5 + 1) {
      uVar10 = ((long)*pcVar5 + uVar10 * 10) - 0x30;
    }
    this_00 = (order_book *)p_Var2[2]._M_nxt;
    order_book::execute(&local_68,this_00,(uint64_t)order_id,quantity);
    uVar7 = this->time_sec * 1000 + this->time_msec;
    this_00->_timestamp = uVar7;
    local_50.sign = itch_trade_sign(local_68.side);
    local_50.timestamp = uVar7;
    local_50.price = uVar10;
    local_50.size = quantity;
    make_event(&eStack_a8,(string *)this_00,this->time_sec * 1000 + this->time_msec,this_00,
               &local_50,(uint)(local_68.remaining == 0) << 2);
    if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar3 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)eStack_a8._symbol._M_dataplus._M_p != &eStack_a8._symbol.field_2) {
        operator_delete(eStack_a8._symbol._M_dataplus._M_p,
                        eStack_a8._symbol.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar3);
    }
    (*(this->_process_event)._M_invoker)((_Any_data *)&this->_process_event,&eStack_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)eStack_a8._symbol._M_dataplus._M_p != &eStack_a8._symbol.field_2) {
      operator_delete(eStack_a8._symbol._M_dataplus._M_p,
                      eStack_a8._symbol.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_order_executed_with_price* m)
{
    uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
    auto it = order_id_map.find(order_id);
    if (it != order_id_map.end()) {
        uint64_t quantity = itch_uatoi(m->ExecutedQuantity, sizeof(m->ExecutedQuantity));
        uint64_t price = itch_uatoi(m->TradePrice, sizeof(m->TradePrice));
        auto& ob = it->second;
        auto result = ob.execute(order_id, quantity);
        ob.set_timestamp(timestamp());
        trade t{timestamp(), price, quantity, itch_trade_sign(result.side)};
        _process_event(make_event(ob.symbol(), timestamp(), &ob, &t, sweep_event(result)));
    }
}